

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

Symbol * createNonrelocSymbol(char *symName,bool numeric)

{
  Symbol *pSVar1;
  char *fmt;
  
  pSVar1 = (Symbol *)hash_GetElement(symbols,symName);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = createsymbol(symName);
    return pSVar1;
  }
  if (pSVar1->type == SYM_REF) {
    if (numeric) {
      return pSVar1;
    }
    fmt = "\'%s\' already referenced at ";
  }
  else {
    fmt = "\'%s\' already defined at ";
  }
  error(fmt,symName);
  dumpFilename(pSVar1);
  putc(10,_stderr);
  return (Symbol *)0x0;
}

Assistant:

static struct Symbol *createNonrelocSymbol(char const *symName, bool numeric)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym)) {
		error("'%s' already defined at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL; // Don't allow overriding the symbol, that'd be bad!
	} else if (!numeric) {
		// The symbol has already been referenced, but it's not allowed
		error("'%s' already referenced at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL; // Don't allow overriding the symbol, that'd be bad!
	}

	return sym;
}